

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  int lane_00;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  string_view local_c8;
  Type local_b4;
  Enum local_b0;
  Enum local_ac;
  Enum local_a8;
  Enum local_a4;
  string_view local_a0;
  Type local_8c;
  Enum local_88;
  Enum local_84;
  int local_80;
  Enum local_7c;
  int lane;
  Enum local_74;
  int lane_count;
  Enum local_6c;
  Enum local_68;
  Enum local_64;
  Type local_60;
  Enum local_5c;
  Type lane_type;
  undefined1 local_48 [8];
  string value_str;
  Type type;
  AllowExpected allow_expected_local;
  ExpectedValue *out_value_local;
  JSONParser *this_local;
  
  value_str.field_2._12_4_ = allow_expected;
  std::__cxx11::string::string((string *)local_48);
  RVar2 = Expect(this,"{");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ExpectKey(this,"type");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      lane_type.enum_ = (Enum)ParseType(this,(Type *)((long)&value_str.field_2 + 8));
      bVar1 = wabt::Failed((Result)lane_type.enum_);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        local_5c = (Enum)Expect(this,",");
        bVar1 = wabt::Failed((Result)local_5c);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          EVar3 = wabt::Type::operator_cast_to_Enum((Type *)((long)&value_str.field_2 + 8));
          if (EVar3 == V128) {
            local_64 = (Enum)ExpectKey(this,"lane_type");
            bVar1 = wabt::Failed((Result)local_64);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            local_68 = (Enum)ParseType(this,&local_60);
            bVar1 = wabt::Failed((Result)local_68);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            local_6c = (Enum)Expect(this,",");
            bVar1 = wabt::Failed((Result)local_6c);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            lane_count = (int)ExpectKey(this,"value");
            bVar1 = wabt::Failed((Result)lane_count);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            local_74 = (Enum)Expect(this,"[");
            bVar1 = wabt::Failed((Result)local_74);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            local_7c = local_60.enum_;
            lane = LaneCountFromType(local_60);
            for (local_80 = 0; local_80 < lane; local_80 = local_80 + 1) {
              local_84 = (Enum)ParseString(this,(string *)local_48);
              bVar1 = wabt::Failed((Result)local_84);
              lane_00 = local_80;
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                goto LAB_002bcef8;
              }
              local_8c.enum_ = local_60.enum_;
              wabt::string_view::string_view(&local_a0,(string *)local_48);
              local_88 = (Enum)ParseLaneConstValue(this,local_8c,lane_00,out_value,local_a0,
                                                   value_str.field_2._12_4_);
              bVar1 = wabt::Failed((Result)local_88);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                goto LAB_002bcef8;
              }
              if (local_80 < lane + -1) {
                local_a4 = (Enum)Expect(this,",");
                bVar1 = wabt::Failed((Result)local_a4);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  goto LAB_002bcef8;
                }
              }
            }
            local_a8 = (Enum)Expect(this,"]");
            bVar1 = wabt::Failed((Result)local_a8);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            (out_value->value).type.enum_ = value_str.field_2._8_4_;
            (out_value->lane_type).enum_ = local_60.enum_;
          }
          else {
            local_ac = (Enum)ParseKeyStringValue(this,"value",(string *)local_48);
            bVar1 = wabt::Failed((Result)local_ac);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            local_b4.enum_ = value_str.field_2._8_4_;
            wabt::string_view::string_view(&local_c8,(string *)local_48);
            local_b0 = (Enum)ParseConstValue(this,local_b4,&(out_value->value).value,out_value->nan,
                                             local_c8,value_str.field_2._12_4_);
            bVar1 = wabt::Failed((Result)local_b0);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_002bcef8;
            }
            (out_value->value).type.enum_ = value_str.field_2._8_4_;
          }
          RVar2 = Expect(this,"}");
          bVar1 = wabt::Failed(RVar2);
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
    }
  }
LAB_002bcef8:
  std::__cxx11::string::~string((string *)local_48);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}